

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O1

hrgls_Status
hrgls_APISetLogMessageCallback(hrgls_API api,hrgls_LogMessageCallback handler,void *userData)

{
  hrgls_Status hVar1;
  
  if (api != (hrgls_API)0x0) {
    api->CHandler = handler;
    api->CUserData = userData;
    if (handler == (hrgls_LogMessageCallback)0x0) {
      hVar1 = hrgls::API::SetLogMessageCallback(api->api,(LogMessageCallback)0x0,(void *)0x0);
    }
    else {
      hVar1 = hrgls::API::SetLogMessageCallback(api->api,LogMessageCallback,api);
    }
    return hVar1;
  }
  return 0x3ee;
}

Assistant:

HRGLS_EXPORT hrgls_Status hrgls_APISetLogMessageCallback(hrgls_API api,
    hrgls_LogMessageCallback handler, void *userData)
  {
    if (!api) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    api->CHandler = handler;
    api->CUserData = userData;
    // If we are supposed to be calling a callback handler, then set our callback handler
    // as the intercept.  If not, then set it to nullptr so that no callbacks are called.
    try {
      if (!handler) {
        return api->api->SetLogMessageCallback(nullptr, nullptr);
      }
      return api->api->SetLogMessageCallback(LogMessageCallback, api);
    } catch (...) {
      return hrgls_STATUS_INTERNAL_EXCEPTION;
    }
  }